

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::Set<(wabt::ExprType)24>
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,
          VarExpr<(wabt::ExprType)24> *ve)

{
  string_view postfix;
  string *str;
  char *in_R8;
  string_view x;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string local_58;
  string_view local_38;
  VarExpr<(wabt::ExprType)24> *local_28;
  VarExpr<(wabt::ExprType)24> *ve_local;
  Value *child_local;
  Decompiler *this_local;
  
  local_28 = ve;
  ve_local = (VarExpr<(wabt::ExprType)24> *)child;
  child_local = (Value *)this;
  this_local = (Decompiler *)__return_storage_ptr__;
  str = Var::name_abi_cxx11_(&ve->var);
  string_view::string_view(&local_78,str);
  local_68 = VarName(this,local_78);
  x.size_ = (size_type)" = ";
  x.data_ = (char *)local_68.size_;
  operator+[abi_cxx11_(&local_58,(wabt *)local_68.data_,x,in_R8);
  string_view::string_view(&local_38,&local_58);
  string_view::string_view(&local_88,"");
  postfix.size_ = local_88.size_;
  postfix.data_ = local_88.data_;
  WrapChild(__return_storage_ptr__,this,child,local_38,postfix,Assign);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Value Set(Value& child, const VarExpr<T>& ve) {
    return WrapChild(child, VarName(ve.var.name()) + " = ", "", Precedence::Assign);
  }